

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  GlobalType global_type;
  undefined1 local_f8 [8];
  string_view local_f0;
  string_view local_e0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  _func_int **local_90;
  value_type local_88;
  string local_70;
  string local_50;
  
  local_e0.size_ = module_name.size_;
  local_e0.data_ = module_name.data_;
  local_f0.size_ = field_name.size_;
  local_f0.data_ = field_name.data_;
  RVar2 = SharedValidator::OnGlobalImport
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     type,mutable_);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_88.super_ExternType.kind = Global;
    local_88.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001ea970;
    local_88.super_ExternType._12_4_ = type.enum_;
    pMVar1 = this->module_;
    local_88.mut = (uint)mutable_;
    string_view::to_string_abi_cxx11_(&local_50,&local_e0);
    string_view::to_string_abi_cxx11_(&local_70,&local_f0);
    GlobalType::Clone((GlobalType *)local_f8);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    local_90 = (_func_int **)local_f8;
    local_f8 = (undefined1  [8])0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)local_d0);
    if (local_90 != (_func_int **)0x0) {
      (**(code **)(*local_90 + 8))();
    }
    local_90 = (_func_int **)0x0;
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (local_f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_f8 + 8))();
    }
    local_f8 = (undefined1  [8])0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,&local_88);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(loc, type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}